

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void absl::lts_20250127::container_internal::
     btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
     ::clear_and_delete(btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                        *node,allocator_type *alloc)

{
  btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  *pbVar1;
  field_type fVar2;
  btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  *pbVar3;
  btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  bVar4;
  ulong uVar5;
  btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  *this;
  
  if (((ulong)node & 7) == 0) {
    if (node[0xb] !=
        (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
         )0x0) {
      start(node);
      count(node);
      bVar4 = (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
               )0x1e;
      if (node[0xb] !=
          (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
           )0x0) {
        bVar4 = node[0xb];
      }
      Deallocate<8ul,std::allocator<google::protobuf::FileDescriptor_const*>>
                (alloc,node,(ulong)((uint)(byte)bVar4 * 8 + 0x10));
      return;
    }
    fVar2 = count(node);
    if (fVar2 == '\0') {
      operator_delete(node,0x1f8);
      return;
    }
    pbVar1 = *(btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
               **)node;
    do {
      if (node[0xb] !=
          (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
           )0x0) {
        this = *(btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                 **)node;
        if (((ulong)this & 7) == 0) {
          uVar5 = (ulong)(byte)node[8];
          if ((byte)this[10] < (byte)node[8]) goto LAB_0023742e;
          goto LAB_0023731d;
        }
        break;
      }
      fVar2 = start(node);
      node = child(node,fVar2);
    } while (((ulong)node & 7) == 0);
  }
LAB_002372e1:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FileDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FileDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
               );
LAB_0023731d:
  pbVar3 = child(this,(field_type)uVar5);
  if (((ulong)pbVar3 & 7) != 0) goto LAB_002372e1;
  if (pbVar3[0xb] ==
      (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
       )0x0) {
    while (pbVar3[0xb] ==
           (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
            )0x0) {
      fVar2 = start(pbVar3);
      pbVar3 = child(pbVar3,fVar2);
      if (((ulong)pbVar3 & 7) != 0) goto LAB_002372e1;
    }
    uVar5 = (ulong)(byte)pbVar3[8];
    this = *(btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
             **)pbVar3;
  }
  start(pbVar3);
  count(pbVar3);
  bVar4 = pbVar3[0xb];
  if (pbVar3[0xb] ==
      (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
       )0x0) {
    bVar4 = (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
             )0x1e;
  }
  Deallocate<8ul,std::allocator<google::protobuf::FileDescriptor_const*>>
            (alloc,pbVar3,(ulong)((uint)(byte)bVar4 * 8 + 0x10));
  if (((ulong)this & 7) != 0) goto LAB_002372e1;
  pbVar3 = this;
  if ((byte)this[10] <= uVar5) {
    do {
      if (((ulong)pbVar3 & 7) != 0) goto LAB_002372e1;
      bVar4 = pbVar3[8];
      uVar5 = (ulong)(byte)bVar4;
      this = *(btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
               **)pbVar3;
      start(pbVar3);
      count(pbVar3);
      operator_delete(pbVar3,0x1f8);
      if (this == pbVar1) {
        return;
      }
      if (((ulong)this & 7) != 0) goto LAB_002372e1;
      pbVar3 = this;
    } while ((byte)this[10] <= (byte)bVar4);
    if ((byte)this[10] <= (byte)bVar4) {
LAB_0023742e:
      __assert_fail("pos <= parent->finish()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/btree.h"
                    ,0x7ef,
                    "static void absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>>::clear_and_delete(btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>]"
                   );
    }
  }
  uVar5 = uVar5 + 1;
  goto LAB_0023731d;
}

Assistant:

void btree_node<P>::clear_and_delete(btree_node *node, allocator_type *alloc) {
  if (node->is_leaf()) {
    node->value_destroy_n(node->start(), node->count(), alloc);
    deallocate(LeafSize(node->max_count()), node, alloc);
    return;
  }
  if (node->count() == 0) {
    deallocate(InternalSize(), node, alloc);
    return;
  }

  // The parent of the root of the subtree we are deleting.
  btree_node *delete_root_parent = node->parent();

  // Navigate to the leftmost leaf under node, and then delete upwards.
  while (node->is_internal()) node = node->start_child();
#ifdef ABSL_BTREE_ENABLE_GENERATIONS
  // When generations are enabled, we delete the leftmost leaf last in case it's
  // the parent of the root and we need to check whether it's a leaf before we
  // can update the root's generation.
  // TODO(ezb): if we change btree_node::is_root to check a bool inside the node
  // instead of checking whether the parent is a leaf, we can remove this logic.
  btree_node *leftmost_leaf = node;
#endif
  // Use `size_type` because `pos` needs to be able to hold `kNodeSlots+1`,
  // which isn't guaranteed to be a valid `field_type`.
  size_type pos = node->position();
  btree_node *parent = node->parent();
  for (;;) {
    // In each iteration of the next loop, we delete one leaf node and go right.
    assert(pos <= parent->finish());
    do {
      node = parent->child(static_cast<field_type>(pos));
      if (node->is_internal()) {
        // Navigate to the leftmost leaf under node.
        while (node->is_internal()) node = node->start_child();
        pos = node->position();
        parent = node->parent();
      }
      node->value_destroy_n(node->start(), node->count(), alloc);
#ifdef ABSL_BTREE_ENABLE_GENERATIONS
      if (leftmost_leaf != node)
#endif
        deallocate(LeafSize(node->max_count()), node, alloc);
      ++pos;
    } while (pos <= parent->finish());

    // Once we've deleted all children of parent, delete parent and go up/right.
    assert(pos > parent->finish());
    do {
      node = parent;
      pos = node->position();
      parent = node->parent();
      node->value_destroy_n(node->start(), node->count(), alloc);
      deallocate(InternalSize(), node, alloc);
      if (parent == delete_root_parent) {
#ifdef ABSL_BTREE_ENABLE_GENERATIONS
        deallocate(LeafSize(leftmost_leaf->max_count()), leftmost_leaf, alloc);
#endif
        return;
      }
      ++pos;
    } while (pos > parent->finish());
  }
}